

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O1

int nghttp2_increase_local_window_size
              (int32_t *param_1,int32_t *recv_window_size_ptr,int32_t *recv_reduction_ptr,
              int32_t *delta_ptr)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = *delta_ptr;
  if (-1 < (int)uVar3) {
    iVar2 = -0x20c;
    if (*param_1 <= (int)(uVar3 ^ 0x7fffffff)) {
      *param_1 = *param_1 + uVar3;
      uVar1 = *recv_reduction_ptr;
      if ((int)uVar1 < (int)uVar3) {
        uVar3 = uVar1;
      }
      *recv_reduction_ptr = uVar1 - uVar3;
      *recv_window_size_ptr = *recv_window_size_ptr + uVar3;
      *delta_ptr = *delta_ptr - uVar3;
      iVar2 = 0;
    }
    return iVar2;
  }
  __assert_fail("delta >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_helper.c"
                ,0xe1,
                "int nghttp2_increase_local_window_size(int32_t *, int32_t *, int32_t *, int32_t *)"
               );
}

Assistant:

int nghttp2_increase_local_window_size(int32_t *local_window_size_ptr,
                                       int32_t *recv_window_size_ptr,
                                       int32_t *recv_reduction_ptr,
                                       int32_t *delta_ptr) {
  int32_t recv_reduction_delta;
  int32_t delta;

  delta = *delta_ptr;

  assert(delta >= 0);

  /* The delta size is strictly more than received bytes. Increase
     local_window_size by that difference |delta|. */
  if (*local_window_size_ptr > NGHTTP2_MAX_WINDOW_SIZE - delta) {
    return NGHTTP2_ERR_FLOW_CONTROL;
  }

  *local_window_size_ptr += delta;
  /* If there is recv_reduction due to earlier window_size
     reduction, we have to adjust it too. */
  recv_reduction_delta = nghttp2_min_int32(*recv_reduction_ptr, delta);
  *recv_reduction_ptr -= recv_reduction_delta;

  *recv_window_size_ptr += recv_reduction_delta;

  /* recv_reduction_delta must be paid from *delta_ptr, since it was
     added in window size reduction (see below). */
  *delta_ptr -= recv_reduction_delta;

  return 0;
}